

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O3

Packet * __thiscall mognetwork::Packet::operator>>(Packet *this,char *data)

{
  int iVar1;
  pointer pcVar2;
  uint uVar3;
  ulong uVar4;
  size_t __n;
  
  uVar3 = this->m_readerPos + 4;
  pcVar2 = (this->m_data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->m_data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar2;
  if (uVar3 <= uVar4) {
    iVar1 = *(int *)(pcVar2 + this->m_readerPos);
    __n = (size_t)iVar1;
    this->m_readerPos = uVar3;
    if ((0 < (long)__n) && (uVar3 + iVar1 <= uVar4)) {
      memcpy(data,pcVar2 + uVar3,__n);
      data[__n] = '\0';
      this->m_readerPos = this->m_readerPos + iVar1;
    }
  }
  return this;
}

Assistant:

Packet& Packet::operator>>(char* data)
  {
    int32_t size = 0;
    *this >> size;

    if (size > 0 && verifySize(size))
      {
	memcpy(data, &((*m_data)[m_readerPos]), size);
	data[size] = '\0';
	m_readerPos += size;
      }
    return (*this);
  }